

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O0

FMFormat EVget_src_ref_format(EVsource source)

{
  FMFormat p_Var1;
  EVsource in_RDI;
  CManager_conflict cm;
  FMFormat ret;
  
  IntCManager_lock((CManager)source,(char *)ret,cm._4_4_);
  p_Var1 = INT_EVget_src_ref_format(in_RDI);
  IntCManager_unlock((CManager)source,(char *)ret,cm._4_4_);
  return p_Var1;
}

Assistant:

extern FMFormat
EVget_src_ref_format ( EVsource source )
{
	FMFormat ret;
	CManager cm = source->cm;
	CManager_lock(cm);
	ret = INT_EVget_src_ref_format(source);
	CManager_unlock(cm);
	return ret;
}